

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O3

void __thiscall ChatClient::jsonReceived(ChatClient *this,QJsonObject *docObj)

{
  char cVar1;
  int iVar2;
  QLatin1String QVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QJsonValue usernameVal;
  QJsonValue senderVal;
  QJsonValue typeVal;
  QArrayData *local_98 [3];
  QString local_80;
  QString local_68;
  QJsonValue local_50 [24];
  QString local_38;
  
  QVar3.m_data = (char *)docObj;
  QVar3.m_size = (qsizetype)local_50;
  QJsonObject::value(QVar3);
  iVar2 = QJsonValue::type();
  if (iVar2 == 0) goto LAB_00109bd3;
  iVar2 = QJsonValue::type();
  if (iVar2 != 3) goto LAB_00109bd3;
  QJsonValue::toString();
  QVar4.m_data = (char *)0x5;
  QVar4.m_size = (qsizetype)local_98;
  iVar2 = QString::compare(QVar4,0x10ab77);
  if (local_98[0] != (QArrayData *)0x0) {
    LOCK();
    (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98[0],2,8);
    }
  }
  if (iVar2 == 0) {
    if (this->m_loggedIn != false) goto LAB_00109bd3;
    QVar9.m_data = (char *)docObj;
    QVar9.m_size = (qsizetype)local_98;
    QJsonObject::value(QVar9);
    iVar2 = QJsonValue::type();
    if (iVar2 != 0) {
      iVar2 = QJsonValue::type();
      if (iVar2 == 1) {
        cVar1 = QJsonValue::toBool(SUB81(local_98,0));
        if (cVar1 == '\0') {
          QVar13.m_data = (char *)docObj;
          QVar13.m_size = (qsizetype)&local_80;
          QJsonObject::value(QVar13);
          QJsonValue::toString();
          loginError(this,&local_68);
LAB_00109b9e:
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,8);
            }
          }
          goto LAB_00109bc1;
        }
        loggedIn(this);
      }
    }
  }
  else {
    QJsonValue::toString();
    QVar5.m_data = (char *)0x7;
    QVar5.m_size = (qsizetype)local_98;
    iVar2 = QString::compare(QVar5,0x10ab8c);
    if (local_98[0] != (QArrayData *)0x0) {
      LOCK();
      (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98[0],2,8);
      }
    }
    if (iVar2 == 0) {
      QVar10.m_data = (char *)docObj;
      QVar10.m_size = (qsizetype)local_98;
      QJsonObject::value(QVar10);
      QVar11.m_data = (char *)docObj;
      QVar11.m_size = (qsizetype)&local_80;
      QJsonObject::value(QVar11);
      iVar2 = QJsonValue::type();
      if (iVar2 != 0) {
        iVar2 = QJsonValue::type();
        if (iVar2 == 3) {
          iVar2 = QJsonValue::type();
          if (iVar2 != 0) {
            iVar2 = QJsonValue::type();
            if (iVar2 == 3) {
              QJsonValue::toString();
              QJsonValue::toString();
              messageReceived(this,&local_68,&local_38);
              if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
                }
              }
              goto LAB_00109b9e;
            }
          }
        }
      }
LAB_00109bc1:
      QJsonValue::~QJsonValue((QJsonValue *)&local_80);
    }
    else {
      QJsonValue::toString();
      QVar6.m_data = (char *)0x7;
      QVar6.m_size = (qsizetype)local_98;
      iVar2 = QString::compare(QVar6,0x10aba0);
      if (local_98[0] != (QArrayData *)0x0) {
        LOCK();
        (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98[0],2,8);
        }
      }
      if (iVar2 == 0) {
        QVar12.m_data = (char *)docObj;
        QVar12.m_size = (qsizetype)local_98;
        QJsonObject::value(QVar12);
        iVar2 = QJsonValue::type();
        if (iVar2 != 0) {
          iVar2 = QJsonValue::type();
          if (iVar2 == 3) {
            QJsonValue::toString();
            userJoined(this,&local_80);
LAB_00109b44:
            if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
              }
            }
          }
        }
      }
      else {
        QJsonValue::toString();
        QVar7.m_data = (char *)0x10;
        QVar7.m_size = (qsizetype)local_98;
        iVar2 = QString::compare(QVar7,0x10abb1);
        if (local_98[0] != (QArrayData *)0x0) {
          LOCK();
          (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98[0],2,8);
          }
        }
        if (iVar2 != 0) goto LAB_00109bd3;
        QVar8.m_data = (char *)docObj;
        QVar8.m_size = (qsizetype)local_98;
        QJsonObject::value(QVar8);
        iVar2 = QJsonValue::type();
        if (iVar2 != 0) {
          iVar2 = QJsonValue::type();
          if (iVar2 == 3) {
            QJsonValue::toString();
            userLeft(this,&local_80);
            goto LAB_00109b44;
          }
        }
      }
    }
  }
  QJsonValue::~QJsonValue((QJsonValue *)local_98);
LAB_00109bd3:
  QJsonValue::~QJsonValue(local_50);
  return;
}

Assistant:

void ChatClient::jsonReceived(const QJsonObject &docObj)
{
    // actions depend on the type of message
    const QJsonValue typeVal = docObj.value(QLatin1String("type"));
    if (typeVal.isNull() || !typeVal.isString())
        return; // a message with no type was received so we just ignore it
    if (typeVal.toString().compare(QLatin1String("login"), Qt::CaseInsensitive) == 0) { //It's a login message
        if (m_loggedIn)
            return; // if we are already logged in we ignore
        // the success field will contain the result of our attempt to login
        const QJsonValue resultVal = docObj.value(QLatin1String("success"));
        if (resultVal.isNull() || !resultVal.isBool())
            return; // the message had no success field so we ignore
        const bool loginSuccess = resultVal.toBool();
        if (loginSuccess) {
            // we logged in succesfully and we notify it via the loggedIn signal
            emit loggedIn();
            return;
        }
        // the login attempt failed, we extract the reason of the failure from the JSON
        // and notify it via the loginError signal
        const QJsonValue reasonVal = docObj.value(QLatin1String("reason"));
        emit loginError(reasonVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("message"), Qt::CaseInsensitive) == 0) { //It's a chat message
        // we extract the text field containing the chat text
        const QJsonValue textVal = docObj.value(QLatin1String("text"));
        // we extract the sender field containing the username of the sender
        const QJsonValue senderVal = docObj.value(QLatin1String("sender"));
        if (textVal.isNull() || !textVal.isString())
            return; // the text field was invalid so we ignore
        if (senderVal.isNull() || !senderVal.isString())
            return; // the sender field was invalid so we ignore
        // we notify a new message was received via the messageReceived signal
        emit messageReceived(senderVal.toString(), textVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("newuser"), Qt::CaseInsensitive) == 0) { // A user joined the chat
        // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the new user via the userJoined signal
        emit userJoined(usernameVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("userdisconnected"), Qt::CaseInsensitive) == 0) { // A user left the chat
         // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the user disconnection the userLeft signal
        emit userLeft(usernameVal.toString());
    }
}